

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.cpp
# Opt level: O1

void __thiscall E64::host_t::video_change_scanlines_intensity(host_t *this)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = this->settings->video_scanlines_alpha;
  bVar2 = 0x40;
  if (((0x3f < bVar1) && (bVar2 = 0x80, (char)bVar1 < '\0')) && (bVar2 = 0xc0, 0xbf < bVar1)) {
    bVar2 = -(bVar1 != 0xff);
  }
  this->settings->video_scanlines_alpha = bVar2;
  hud_t::show_notification(this->hud,"Scanlines alpha value = %3u",(ulong)bVar2);
  return;
}

Assistant:

void E64::host_t::video_change_scanlines_intensity()
{
	if (settings->video_scanlines_alpha < 64) {
		settings->video_scanlines_alpha = 64;
	} else if (settings->video_scanlines_alpha < 128) {
		settings->video_scanlines_alpha = 128;
	} else if (settings->video_scanlines_alpha < 192) {
		settings->video_scanlines_alpha = 192;
	} else if (settings->video_scanlines_alpha < 255) {
		settings->video_scanlines_alpha = 255;
	} else {
		settings->video_scanlines_alpha = 0;
	}
	hud->show_notification("Scanlines alpha value = %3u", settings->video_scanlines_alpha);
}